

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_64kB_sector_erase(Spi *this,int addr)

{
  uint8_t command [4];
  
  if (this->verbose == true) {
    fprintf(_stdout,"erase 64kB sector at 0x%06X..\n",addr);
  }
  command[0] = 0xd8;
  command[1] = (uint8_t)((uint)addr >> 0x10);
  command[2] = (uint8_t)((uint)addr >> 8);
  command[3] = (uint8_t)addr;
  flash_chip_select(this);
  send_spi(this,command,4);
  flash_chip_deselect(this);
  return;
}

Assistant:

void Spi::flash_64kB_sector_erase(int addr) {
	if (verbose)
		fprintf(stdout, "erase 64kB sector at 0x%06X..\n", addr);

	uint8_t command[4] = { FC_BE64, (uint8_t) (addr >> 16),
			(uint8_t) (addr >> 8), (uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	flash_chip_deselect();
}